

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply_property ply_grow_property(p_ply ply,p_ply_element element)

{
  p_ply_property property_00;
  long *in_RSI;
  void **in_RDI;
  p_ply_property property;
  p_ply in_stack_fffffffffffffff8;
  
  property_00 = (p_ply_property)ply_grow_array(in_stack_fffffffffffffff8,in_RDI,in_RSI,0);
  if (property_00 == (p_ply_property)0x0) {
    property_00 = (p_ply_property)0x0;
  }
  else {
    ply_property_init(property_00);
  }
  return property_00;
}

Assistant:

static p_ply_property ply_grow_property(p_ply ply, p_ply_element element) {
    p_ply_property property = NULL;
    assert(ply);
    assert(element);
    assert(element->property || element->nproperties == 0);
    assert(!element->property || element->nproperties > 0);
    property = (p_ply_property) ply_grow_array(ply,
            (void **) &element->property,
            &element->nproperties, sizeof(t_ply_property));
    if (!property) return NULL;
    ply_property_init(property);
    return property;
}